

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_WoW6.cpp
# Opt level: O1

LPBYTE __thiscall TRootHandler_WoW6::Search(TRootHandler_WoW6 *this,TCascSearch *pSearch)

{
  char *szBuffer;
  bool bVar1;
  LPBYTE pBVar2;
  size_t sVar3;
  PCASC_FILE_NODE pFileNode;
  CASC_FILE_TREE *this_00;
  
  pBVar2 = TFileTreeRoot::Search(&this->super_TFileTreeRoot,pSearch);
  if (pBVar2 == (LPBYTE)0x0) {
    if (pSearch->pCache != (void *)0x0) {
      szBuffer = pSearch->szFileName;
      sVar3 = ListFile_GetNext(pSearch->pCache,pSearch->szMask,szBuffer,0x400);
      if (sVar3 != 0) {
        this_00 = &(this->super_TFileTreeRoot).FileTree;
        do {
          bVar1 = CheckWildCard(szBuffer,pSearch->szMask);
          if ((bVar1) &&
             (pFileNode = CASC_FILE_TREE::Find(this_00,szBuffer,(PDWORD)0x0),
             pFileNode != (PCASC_FILE_NODE)0x0)) {
            CASC_FILE_TREE::GetExtras
                      (this_00,pFileNode,&pSearch->dwFileDataId,(PDWORD)0x0,&pSearch->dwLocaleFlags)
            ;
            return (LPBYTE)pFileNode;
          }
          sVar3 = ListFile_GetNext(pSearch->pCache,pSearch->szMask,szBuffer,0x400);
        } while (sVar3 != 0);
      }
    }
    pBVar2 = (LPBYTE)0x0;
  }
  return pBVar2;
}

Assistant:

LPBYTE Search(TCascSearch * pSearch)
    {
        PCASC_FILE_NODE pFileNode;
        LPBYTE pbEKey;

        // Try to find named items
        pbEKey = TFileTreeRoot::Search(pSearch);
        if(pbEKey != NULL)
            return pbEKey;

        // Only if we have a listfile
        if(pSearch->pCache != NULL)
        {
            // Keep going through the listfile
            while(ListFile_GetNext(pSearch->pCache, pSearch->szMask, pSearch->szFileName, MAX_PATH))
            {
                // Check the wildcard first
                if (CheckWildCard(pSearch->szFileName, pSearch->szMask))
                {
                    // Retrieve the file item
                    pFileNode = FileTree.Find(pSearch->szFileName, NULL);
                    if(pFileNode != NULL)
                    {
                        FileTree.GetExtras(pFileNode, &pSearch->dwFileDataId, NULL, &pSearch->dwLocaleFlags);
                        return pFileNode->CKey.Value;
                    }
                }
            }
        }

        // No more files
        return NULL;
    }